

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

void __thiscall nv::Kernel2::transpose(Kernel2 *this)

{
  uint local_18;
  uint local_14;
  uint j;
  uint i;
  Kernel2 *this_local;
  
  for (local_14 = 0; local_18 = local_14, local_14 < this->m_windowSize; local_14 = local_14 + 1) {
    while (local_18 = local_18 + 1, local_18 < this->m_windowSize) {
      swap<float>(this->m_data + (local_14 * this->m_windowSize + local_18),
                  this->m_data + (local_18 * this->m_windowSize + local_14));
    }
  }
  return;
}

Assistant:

void Kernel2::transpose()
{
	for(uint i = 0; i < m_windowSize; i++) {
		for(uint j = i+1; j < m_windowSize; j++) {
			swap(m_data[i*m_windowSize + j], m_data[j*m_windowSize + i]);
		}
	}
}